

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O3

int main(int argc,char **argv)

{
  __u8 *p_Var1;
  char *pcVar2;
  int iVar3;
  __time_t _Var4;
  __suseconds_t _Var5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  undefined8 uVar15;
  long lVar16;
  long *plVar17;
  size_t sVar18;
  char **__src;
  undefined8 unaff_R12;
  undefined *puVar19;
  timeval timeo;
  sockaddr_can addr;
  timeval start_tv;
  fd_set rdfs;
  char acStack_210 [48];
  undefined1 uStack_1e0;
  char acStack_1df [9];
  byte bStack_1d6;
  char acStack_1d4 [14];
  char acStack_1c6 [126];
  ulong uStack_148;
  undefined *puStack_140;
  undefined8 uStack_138;
  char **ppcStack_130;
  char *pcStack_128;
  code *pcStack_120;
  uint local_110;
  int local_10c;
  timeval local_108;
  long local_f0;
  timeval local_e8;
  sockaddr local_d8;
  timeval local_c0;
  fd_set local_b0;
  
  pcStack_120 = (code *)0x101575;
  signal(0xf,sigterm);
  pcStack_120 = (code *)0x101582;
  signal(1,sigterm);
  pcStack_120 = (code *)0x10158f;
  signal(2,sigterm);
  lVar10 = 0;
  do {
    p_Var1 = sniftab[0].last.data + lVar10 + -0x40;
    *p_Var1 = *p_Var1 | 1;
    lVar10 = lVar10 + 0x158;
  } while (lVar10 != 0xac000);
  puVar19 = (undefined *)CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
  uVar6 = 0;
switchD_001015e4_caseD_f:
  uVar15 = uVar6;
  pcStack_120 = (code *)0x1015cd;
  uVar7 = getopt(argc,argv,"r:t:h:l:f:qeb8Bc?");
  if (0x41 < (int)uVar7) {
    uVar8 = uVar7 - 0x62;
    if (0x12 < uVar8) {
      if (uVar7 == 0x42) {
        binary = 1;
        binary_gap = 1;
        uVar6 = uVar15;
      }
      else {
switchD_001015e4_caseD_2:
        pcStack_120 = (code *)0x101742;
        fprintf(_stderr,"Unknown option %c\n",(ulong)uVar7);
        uVar6 = uVar15;
      }
      goto switchD_001015e4_caseD_f;
    }
    uVar6 = CONCAT71((uint7)(uint3)(uVar8 >> 8),1);
    switch(uVar8) {
    case 0:
      goto LAB_00101614;
    case 1:
      color = 1;
      uVar6 = uVar15;
      goto switchD_001015e4_caseD_f;
    default:
      goto switchD_001015e4_caseD_2;
    case 3:
      print_eff = 1;
      uVar6 = uVar15;
      goto switchD_001015e4_caseD_f;
    case 4:
      pcStack_120 = (code *)0x101678;
      __isoc99_sscanf(_optarg,"%ld",&canfd_mode);
      uVar6 = uVar15;
      if (1 < (ulong)canfd_mode) {
        canfd_mode = 2;
      }
      goto switchD_001015e4_caseD_f;
    case 6:
      plVar17 = &hold;
      break;
    case 10:
      plVar17 = &loop;
      break;
    case 0xf:
      goto switchD_001015e4_caseD_f;
    case 0x10:
      goto switchD_001015e4_caseD_10;
    case 0x12:
      plVar17 = &timeout;
    }
    pcStack_120 = (code *)0x101712;
    __isoc99_sscanf(_optarg,"%ld",plVar17);
    uVar6 = uVar15;
    goto switchD_001015e4_caseD_f;
  }
  if (uVar7 == 0x38) {
    binary8 = 1;
    vdl = "|";
LAB_00101614:
    binary = 1;
    binary_gap = 0;
    uVar6 = uVar15;
    goto switchD_001015e4_caseD_f;
  }
  if (uVar7 != 0xffffffff) {
    if (uVar7 != 0x3f) goto switchD_001015e4_caseD_2;
    pcStack_120 = (code *)0x101aaa;
    main_cold_1();
    goto LAB_00101aaa;
  }
  puVar19 = &optind;
  lVar10 = (long)_optind;
  if (_optind == argc) goto LAB_00101aaf;
  if ((char)uVar15 != '\0') {
    lVar16 = 0;
    do {
      p_Var1 = sniftab[0].last.data + lVar16 + -0x40;
      *p_Var1 = *p_Var1 & 0xfe;
      lVar16 = lVar16 + 0x158;
    } while (lVar16 != 0xac000);
  }
  pcVar2 = argv[lVar10];
  pcStack_120 = (code *)0x10178b;
  sVar18 = strlen(pcVar2);
  if (sVar18 < 0x10) {
    pcStack_120 = (code *)0x1017c8;
    interface = pcVar2;
    uVar7 = socket(0x1d,3,1);
    if ((int)uVar7 < 0) {
      pcStack_120 = (code *)0x101a74;
      perror("socket");
      return 1;
    }
    local_d8.sa_family = 0x1d;
    local_d8.sa_data[2] = '\0';
    local_d8.sa_data[3] = '\0';
    local_d8.sa_data[4] = '\0';
    local_d8.sa_data[5] = '\0';
    pcVar2 = argv[_optind];
    pcStack_120 = (code *)0x1017f8;
    iVar9 = strcmp("any",pcVar2);
    if (iVar9 != 0) {
      pcStack_120 = (code *)0x101804;
      local_d8.sa_data._2_4_ = if_nametoindex(pcVar2);
      if (local_d8.sa_data._2_4_ == 0) {
        pcStack_120 = (code *)0x101a85;
        perror("if_nametoindex");
        goto LAB_0010184c;
      }
    }
    if (canfd_mode != 0) {
      local_b0.fds_bits[0] = CONCAT44(local_b0.fds_bits[0]._4_4_,1);
      pcStack_120 = (code *)0x10183c;
      iVar9 = setsockopt(uVar7,0x65,5,&local_b0,4);
      if (iVar9 != 0) {
        pcStack_120 = (code *)0x10184c;
        puts("error when enabling CAN FD support");
        goto LAB_0010184c;
      }
      max_dlen = '\x01';
      name_sep = 1;
      print_ascii = 0;
    }
    pcStack_120 = (code *)0x101890;
    iVar9 = bind(uVar7,&local_d8,0x18);
    if (iVar9 < 0) {
      pcStack_120 = (code *)0x101a96;
      perror("bind");
      pcStack_120 = (code *)0x101a9d;
      close(uVar7);
    }
    else {
      pcStack_120 = (code *)0x1018ab;
      local_110 = uVar7;
      gettimeofday(&local_c0,(__timezone_ptr_t)0x0);
      local_108.tv_sec = 0;
      local_108.tv_usec = 0;
      pcStack_120 = (code *)0x1018c8;
      printf("%s","\x1b[?25l");
      if (running != 0) {
        uVar12 = 1L << ((byte)local_110 & 0x3f);
        uVar7 = local_110 >> 6;
        local_10c = local_110 + 1;
        local_f0 = local_c0.tv_sec;
        lVar10 = 0;
        do {
          while( true ) {
            local_b0.fds_bits[0xd] = 0;
            local_b0.fds_bits[0xe] = 0;
            local_b0.fds_bits[0xb] = 0;
            local_b0.fds_bits[0xc] = 0;
            local_b0.fds_bits[9] = 0;
            local_b0.fds_bits[10] = 0;
            local_b0.fds_bits[7] = 0;
            local_b0.fds_bits[8] = 0;
            local_b0.fds_bits[5] = 0;
            local_b0.fds_bits[6] = 0;
            local_b0.fds_bits[3] = 0;
            local_b0.fds_bits[4] = 0;
            local_b0.fds_bits[1] = 0;
            local_b0.fds_bits[2] = 0;
            local_b0.fds_bits[0xf] = 0;
            local_b0.fds_bits[0] = 1;
            local_b0.fds_bits[uVar7] = local_b0.fds_bits[uVar7] | uVar12;
            local_e8.tv_sec = 0;
            local_e8.tv_usec = loop * 10000;
            pcStack_120 = (code *)0x101961;
            iVar9 = select(local_10c,&local_b0,(fd_set *)0x0,(fd_set *)0x0,&local_e8);
            if (iVar9 < 0) {
              running = 0;
              goto LAB_00101a2d;
            }
            pcStack_120 = (code *)0x101975;
            gettimeofday(&local_108,(__timezone_ptr_t)0x0);
            _Var5 = local_108.tv_usec;
            _Var4 = local_108.tv_sec;
            if ((local_b0.fds_bits[0] & 1U) != 0) {
              pcStack_120 = (code *)0x101998;
              uVar8 = handle_keyb();
              running = running & uVar8;
            }
            lVar16 = _Var5 / 10000 + (_Var4 - local_f0) * 100;
            if ((local_b0.fds_bits[uVar7] & uVar12) != 0) {
              pcStack_120 = (code *)0x1019cb;
              uVar8 = handle_frame(local_110,lVar16);
              running = running & uVar8;
            }
            if (loop <= lVar16 - lVar10) break;
            if (running == 0) {
              iVar9 = 0;
              goto LAB_00101a2d;
            }
          }
          pcStack_120 = (code *)0x1019fa;
          handle_timeo(lVar16);
          uVar14 = running & 1;
          iVar9 = 0;
          uVar8 = running & 1;
          running = uVar14;
          lVar10 = lVar16;
        } while (uVar8 != 0);
      }
LAB_00101a2d:
      pcStack_120 = (code *)0x101a42;
      printf("%s","\x1b[?25h");
      pcStack_120 = (code *)0x101a4b;
      close(local_110);
      if (signal_num != 0) {
        iVar9 = signal_num + 0x80;
      }
    }
  }
  else {
    pcStack_120 = (code *)0x1017a2;
    printf("name of CAN device \'%s\' is too long!\n",pcVar2);
LAB_0010184c:
    iVar9 = 1;
  }
  return iVar9;
switchD_001015e4_caseD_10:
  pcStack_120 = (code *)0x1016e3;
  iVar9 = readsettings(_optarg);
  uVar6 = uVar15;
  if (iVar9 < 0) goto LAB_00101aaa;
  goto switchD_001015e4_caseD_f;
LAB_00101aaa:
  pcStack_120 = (code *)0x101aaf;
  main_cold_2();
LAB_00101aaf:
  pcStack_120 = readsettings;
  __src = argv;
  main_cold_3();
  pcStack_120 = (code *)&switchD_001015e4::switchdataD_00103004;
  pcStack_128 = "r:t:h:l:f:qeb8Bc?";
  uStack_148 = (ulong)(uint)argc;
  puStack_140 = puVar19;
  uStack_138 = uVar15;
  ppcStack_130 = argv;
  memset(&uStack_1e0,0,0x8e);
  if (canfd_mode == 1) {
    builtin_strncpy(acStack_210 + 8,"_fd.",5);
    sVar18 = 0x8d;
  }
  else {
    if (canfd_mode != 0) {
      puts("readsettings failed due to unspecified CAN FD mode");
      return -1;
    }
    acStack_210[8] = '.';
    acStack_210[9] = '\0';
    sVar18 = 0x1d;
  }
  builtin_strncpy(acStack_210,"sniffset",8);
  sVar11 = strlen(acStack_210);
  strncat(acStack_210,(char *)__src,0x28 - sVar11);
  iVar9 = open(acStack_210,0);
  if (iVar9 < 1) {
    return -1;
  }
  idx = 0;
  do {
    sVar11 = read(iVar9,&uStack_1e0,sVar18);
    if (sVar11 != sVar18) break;
    uVar12 = strtoul(acStack_1df,(char **)0x0,0x10);
    lVar10 = (long)idx;
    sniftab[lVar10].current.can_id = (canid_t)uVar12;
    sniftab[lVar10].flags = sniftab[lVar10].flags & 0xfffffffeU | bStack_1d6 & 1;
    lVar10 = 7;
    if (max_dlen != '\0') {
      lVar10 = 0x3f;
    }
    uVar12 = (ulong)(uint)((int)lVar10 * 2);
    lVar10 = lVar10 + 0x106298;
    do {
      uVar13 = strtoul(acStack_1d4 + uVar12,(char **)0x0,0x10);
      iVar3 = idx;
      *(char *)(lVar10 + (long)idx * 0x158) = (char)uVar13;
      acStack_1d4[uVar12] = '\0';
      uVar12 = uVar12 - 2;
      lVar10 = lVar10 + -1;
    } while (uVar12 != 0xfffffffffffffffe);
    idx = iVar3 + 1;
  } while (iVar3 < 0x7ff);
  close(iVar9);
  return idx;
}

Assistant:

int main(int argc, char **argv)
{
	fd_set rdfs;
	int s;
	long currcms = 0;
	long lastcms = 0;
	unsigned char quiet = 0;
	int opt, ret = 0;
	struct timeval timeo, start_tv, tv;
	struct sockaddr_can addr;
	int i;

	signal(SIGTERM, sigterm);
	signal(SIGHUP, sigterm);
	signal(SIGINT, sigterm);

	for (i = 0; i < MAX_SLOTS ;i++) /* default: enable all slots */
		do_set(i, ENABLE);

	while ((opt = getopt(argc, argv, "r:t:h:l:f:qeb8Bc?")) != -1) {
		switch (opt) {
		case 'r':
			if (readsettings(optarg) < 0) {
				fprintf(stderr, "Unable to read setting file '%s%s'!\n", SETFNAME, optarg);
				exit(1);
			}
			break;

		case 't':
			sscanf(optarg, "%ld", &timeout);
			break;

		case 'h':
			sscanf(optarg, "%ld", &hold);
			break;

		case 'l':
			sscanf(optarg, "%ld", &loop);
			break;

		case 'f':
			sscanf(optarg, "%ld", &canfd_mode);
			if ((canfd_mode != CANFD_ON) && (canfd_mode != CANFD_OFF))
				canfd_mode = CANFD_AUTO;
			break;

		case 'q':
			quiet = 1;
			break;

		case 'e':
			print_eff = 1;
			break;

		case 'b':
			binary = 1;
			binary_gap = 0;
			break;

		case '8':
			binary = 1;
			binary8 = 1; /* enable variable delimiter for EFF */
			switchvdl(SDL); /* switch directly to short delimiter */
			binary_gap = 0;
			break;

		case 'B':
			binary = 1;
			binary_gap = 1;
			break;

		case 'c':
			color = 1;
			break;

		case '?':
			print_usage(basename(argv[0]));
			exit(0);
			break;

		default:
			fprintf(stderr, "Unknown option %c\n", opt);
			break;
		}
	}

	if (optind == argc) {
		print_usage(basename(argv[0]));
		exit(0);
	}

	if (quiet)
		for (i = 0; i < MAX_SLOTS; i++)
			do_clr(i, ENABLE);

	if (strlen(argv[optind]) >= IFNAMSIZ) {
		printf("name of CAN device '%s' is too long!\n", argv[optind]);
		return 1;
	}

	interface = argv[optind];

	s = socket(PF_CAN, SOCK_RAW, CAN_RAW);
	if (s < 0) {
		perror("socket");
		return 1;
	}

	addr.can_family = AF_CAN;
	addr.can_ifindex = 0; /* 'any' CAN interface */

	/* check for specific CAN interface */
	if (strcmp(ANYDEV, argv[optind]) != 0) {
		addr.can_ifindex = if_nametoindex(argv[optind]);
		if (!addr.can_ifindex) {
			perror("if_nametoindex");
			return 1;
		}
	}

	/* enable CAN FD if not disabled by command line option */
	if (canfd_mode != CANFD_OFF) {
		const int enable_canfd = 1;

		if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES,
			       &enable_canfd, sizeof(enable_canfd))){
			printf("error when enabling CAN FD support\n");
			return 1;
		}

		/* might be changed in CANFD_AUTO mode */
		max_dlen = CANFD_MAX_DLEN;
		name_sep = FD_SEP;
		print_ascii = 0; /* don't print ASCII for CAN FD by default */
	}

	ret = bind(s, (struct sockaddr *)&addr, sizeof(addr));
	if (ret < 0) {
		perror("bind");
		close(s);
		return ret;
	}

	gettimeofday(&start_tv, NULL);
	tv.tv_sec = tv.tv_usec = 0;

	printf("%s", CSR_HIDE); /* hide cursor */

	while (running) {

		FD_ZERO(&rdfs);
		FD_SET(0, &rdfs);
		FD_SET(s, &rdfs);

		timeo.tv_sec  = 0;
		timeo.tv_usec = 10000 * loop;

		ret = select(s+1, &rdfs, NULL, NULL, &timeo);
		if (ret < 0) {
			//perror("select");
			running = 0;
			continue;
		} else
			ret = 0;

		gettimeofday(&tv, NULL);
		currcms = (tv.tv_sec - start_tv.tv_sec) * 100 + (tv.tv_usec / 10000);

		if (FD_ISSET(0, &rdfs))
			running &= handle_keyb();

		if (FD_ISSET(s, &rdfs))
			running &= handle_frame(s, currcms);

		if (currcms - lastcms >= loop) {
			running &= handle_timeo(currcms);
			lastcms = currcms;
		}
	}

	printf("%s", CSR_SHOW); /* show cursor */

	close(s);

	if (signal_num)
		return 128 + signal_num;

	return ret;
}